

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covscript.cpp
# Opt level: O1

var __thiscall cs::eval(cs *this,context_t *context,string *expr)

{
  size_type sVar1;
  char *ch;
  pointer __args;
  tree_type<cs::token_base_*> tree;
  deque<char,_std::allocator<char>_> buff;
  tree_type<cs::token_base_*> local_88;
  tree_node *local_80;
  _Deque_base<char,_std::allocator<char>_> local_78;
  
  local_88.mRoot = (tree_node *)0x0;
  local_78._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_finish._M_cur = (char *)0x0;
  local_78._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<char,_std::allocator<char>_>::_M_initialize_map(&local_78,0);
  sVar1 = expr->_M_string_length;
  if (sVar1 != 0) {
    __args = (expr->_M_dataplus)._M_p;
    do {
      if (local_78._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_78._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<char,std::allocator<char>>::_M_push_back_aux<char_const&>
                  ((deque<char,std::allocator<char>> *)&local_78,__args);
      }
      else {
        *local_78._M_impl.super__Deque_impl_data._M_finish._M_cur = *__args;
        local_78._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_78._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      __args = __args + 1;
      sVar1 = sVar1 - 1;
    } while (sVar1 != 0);
  }
  compiler_type::build_expr
            ((((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (deque<char,_std::allocator<char>_> *)&local_78,&local_88,utf8);
  local_80 = local_88.mRoot;
  runtime_type::parse_expr
            ((runtime_type *)this,
             (iterator *)
             (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             SUB81(&local_80,0));
  std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base(&local_78);
  tree_type<cs::token_base_*>::destroy(local_88.mRoot);
  return (var)(proxy *)this;
}

Assistant:

cs::var eval(const context_t &context, const std::string &expr)
	{
		tree_type<cs::token_base *> tree;
		std::deque<char> buff;
		for (auto &ch: expr)
			buff.push_back(ch);
		context->compiler->build_expr(buff, tree);
		return context->instance->parse_expr(tree.root());
	}